

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

Matrix44 * jpgd::DCT_Upsample::operator+(Matrix44 *__return_storage_ptr__,Matrix44 *a,Matrix44 *b)

{
  int iVar1;
  int iVar2;
  Element_Type *pEVar3;
  undefined4 local_1c;
  int r;
  Matrix44 *b_local;
  Matrix44 *a_local;
  
  Matrix44::Matrix44(__return_storage_ptr__);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pEVar3 = Matrix44::at(a,local_1c,0);
    iVar1 = *pEVar3;
    pEVar3 = Matrix44::at(b,local_1c,0);
    iVar2 = *pEVar3;
    pEVar3 = Matrix44::at(__return_storage_ptr__,local_1c,0);
    *pEVar3 = iVar1 + iVar2;
    pEVar3 = Matrix44::at(a,local_1c,1);
    iVar1 = *pEVar3;
    pEVar3 = Matrix44::at(b,local_1c,1);
    iVar2 = *pEVar3;
    pEVar3 = Matrix44::at(__return_storage_ptr__,local_1c,1);
    *pEVar3 = iVar1 + iVar2;
    pEVar3 = Matrix44::at(a,local_1c,2);
    iVar1 = *pEVar3;
    pEVar3 = Matrix44::at(b,local_1c,2);
    iVar2 = *pEVar3;
    pEVar3 = Matrix44::at(__return_storage_ptr__,local_1c,2);
    *pEVar3 = iVar1 + iVar2;
    pEVar3 = Matrix44::at(a,local_1c,3);
    iVar1 = *pEVar3;
    pEVar3 = Matrix44::at(b,local_1c,3);
    iVar2 = *pEVar3;
    pEVar3 = Matrix44::at(__return_storage_ptr__,local_1c,3);
    *pEVar3 = iVar1 + iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix44 operator + (const Matrix44& a, const Matrix44& b)
    {
      Matrix44 ret;
      for (int r = 0; r < NUM_ROWS; r++)
      {
        ret.at(r, 0) = a.at(r, 0) + b.at(r, 0);
        ret.at(r, 1) = a.at(r, 1) + b.at(r, 1);
        ret.at(r, 2) = a.at(r, 2) + b.at(r, 2);
        ret.at(r, 3) = a.at(r, 3) + b.at(r, 3);
      }
      return ret;
    }